

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  uint uVar1;
  uint uVar2;
  cTValue *pcVar3;
  TValue *pTVar4;
  code *cont;
  MMS mm;
  
  pcVar3 = o1;
  if (((o1->field_2).it == 0xfffffff5) || (pcVar3 = o2, (o2->field_2).it == 0xfffffff5)) {
    pcVar3 = lj_meta_lookup(L,pcVar3,MM_le - ((op & 2U) == 0));
    if ((pcVar3->field_2).it == 0xffffffff) {
LAB_0010ab56:
      lj_err_comp(L,o1,o2);
    }
    cont = lj_cont_condf;
    if ((op & 1U) == 0) {
      cont = lj_cont_condt;
    }
  }
  else {
    pcVar3 = o1;
    if ((o2->field_2).it == 0xfffffffb && (o1->field_2).it == 0xfffffffb) {
      uVar1 = lj_str_cmp((GCstr *)(ulong)(o1->u32).lo,(GCstr *)(ulong)(o2->u32).lo);
      uVar2 = uVar1 >> 0x1f;
      if ((op & 2U) != 0) {
        uVar2 = (uint)((int)uVar1 < 1);
      }
      return (TValue *)(ulong)(uVar2 ^ op & 1U);
    }
    while( true ) {
      o1 = pcVar3;
      mm = MM_le - ((op & 2U) == 0);
      pcVar3 = lj_meta_lookup(L,o1,mm);
      if (((pcVar3->field_2).it != 0xffffffff) ||
         (pcVar3 = lj_meta_lookup(L,o2,mm), (pcVar3->field_2).it != 0xffffffff)) break;
      if ((op & 2U) == 0) goto LAB_0010ab56;
      op = op ^ 3;
      pcVar3 = o2;
      o2 = o1;
    }
    cont = lj_cont_condf;
    if ((op & 1U) == 0) {
      cont = lj_cont_condt;
    }
  }
  pTVar4 = mmcall(L,cont,pcVar3,o1,o2);
  return pTVar4;
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}